

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O3

void __thiscall
bssl::anon_unknown_0::SSLVersionTest_DifferentKeyNoResume_Test::TestBody
          (SSLVersionTest_DifferentKeyNoResume_Test *this)

{
  pointer pcVar1;
  int iVar2;
  pointer *__ptr;
  char *in_R9;
  char *pcVar3;
  pointer *__ptr_2;
  UniquePtr<SSL_SESSION> session;
  UniquePtr<SSL> client;
  UniquePtr<SSL> server;
  UniquePtr<SSL_CTX> server_ctx2;
  uint8_t key2 [48];
  uint8_t key1 [48];
  Message local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_140;
  AssertHelper local_138;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_130;
  _Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false> local_128;
  undefined1 local_120 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  _Head_base<0UL,_ssl_st_*,_false> local_100;
  _Head_base<0UL,_ssl_st_*,_false> local_f8;
  undefined1 local_f0 [8];
  undefined1 local_e8 [16];
  undefined1 local_d8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_c0;
  _Head_base<0UL,_x509_st_*,_false> _Stack_b0;
  undefined1 local_a8 [32];
  uchar local_88 [48];
  uchar local_58 [56];
  
  RAND_bytes(local_58,0x30);
  RAND_bytes(local_88,0x30);
  SSLVersionTest::CreateContext((SSLVersionTest *)local_f0);
  local_120[0] = (internal)(local_f0 != (undefined1  [8])0x0);
  local_118 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_f0 == (undefined1  [8])0x0) {
    testing::Message::Message(&local_148);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_e8,(internal *)local_120,(AssertionResult *)"server_ctx2","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_128,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x20b3,(char *)local_e8._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_128,&local_148);
  }
  else {
    local_120[0] = (internal)
                   SSLVersionTest::UseCertAndKey(&this->super_SSLVersionTest,(SSL_CTX *)local_f0);
    local_118 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((bool)local_120[0]) {
      iVar2 = SSL_CTX_set_tlsext_ticket_keys
                        ((this->super_SSLVersionTest).server_ctx_._M_t.
                         super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,local_58,0x30);
      local_120[0] = (internal)(iVar2 != 0);
      local_118 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar2 == 0) {
        testing::Message::Message(&local_148);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_e8,(internal *)local_120,
                   (AssertionResult *)
                   "SSL_CTX_set_tlsext_ticket_keys(server_ctx_.get(), key1, sizeof(key1))","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_128,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x20b6,(char *)local_e8._0_8_);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_128,&local_148);
      }
      else {
        iVar2 = SSL_CTX_set_tlsext_ticket_keys((SSL_CTX *)local_f0,local_88,0x30);
        local_120[0] = (internal)(iVar2 != 0);
        local_118 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if ((bool)local_120[0]) {
          SSL_CTX_set_session_cache_mode
                    ((this->super_SSLVersionTest).client_ctx_._M_t.
                     super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,3);
          SSL_CTX_set_session_cache_mode
                    ((this->super_SSLVersionTest).server_ctx_._M_t.
                     super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,3);
          SSL_CTX_set_session_cache_mode((SSL_CTX *)local_f0,3);
          pcVar1 = local_d8 + 0x10;
          local_d8._8_8_ = (ssl_st *)0x0;
          aStack_c0._0_8_ = (ssl_ctx_st *)0x0;
          _Stack_b0._M_head_impl = (x509_st *)0x0;
          local_a8._8_8_ = 0;
          local_e8._0_8_ = (GTestFlagSaver *)0x0;
          local_e8._8_8_ = (_func_int **)0x0;
          local_d8._16_8_ = (ssl_st *)0x0;
          local_a8._0_8_ = (evp_pkey_st *)0x0;
          local_a8._16_8_ = 0;
          local_d8._0_8_ = pcVar1;
          aStack_c0._8_8_ = local_a8;
          CreateClientSession((anon_unknown_0 *)&local_128,
                              (this->super_SSLVersionTest).client_ctx_._M_t.
                              super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                              (this->super_SSLVersionTest).server_ctx_._M_t.
                              super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                              (ClientConfig *)local_e8);
          if ((undefined1 *)aStack_c0._8_8_ != local_a8) {
            operator_delete((void *)aStack_c0._8_8_,(ulong)(local_a8._0_8_ + 1));
          }
          if ((pointer)local_d8._0_8_ != pcVar1) {
            operator_delete((void *)local_d8._0_8_,(ulong)(local_d8._16_8_ + 1));
          }
          local_120[0] = (internal)
                         ((tuple<testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
                           )local_128._M_head_impl !=
                         (_Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>)0x0);
          local_118 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if ((tuple<testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
               )local_128._M_head_impl ==
              (_Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>)0x0) {
            testing::Message::Message(&local_148);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_e8,(internal *)local_120,(AssertionResult *)0x34e814,"false",
                       "true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_100,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x20c1,(char *)local_e8._0_8_);
            testing::internal::AssertHelper::operator=((AssertHelper *)&local_100,&local_148);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_100);
            if ((undefined1 *)local_e8._0_8_ != local_d8) {
              operator_delete((void *)local_e8._0_8_,(ulong)(local_d8._0_8_ + 1));
            }
            if ((long *)CONCAT71(local_148.ss_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl._1_7_,
                                 local_148.ss_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl._0_1_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT71(local_148.ss_._M_t.
                                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                             ._M_head_impl._1_7_,
                                             local_148.ss_._M_t.
                                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                             ._M_head_impl._0_1_) + 8))();
            }
            if (local_118 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_118,local_118);
            }
          }
          else {
            local_e8._8_8_ = (_func_int **)0x0;
            local_d8._8_8_ = (__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>)0x0;
            local_d8._16_8_ = local_d8._16_8_ & 0xffffffffffffff00;
            _Stack_b0._M_head_impl = (x509_st *)0x0;
            local_a8._0_8_ = local_a8._0_8_ & 0xffffffffffffff00;
            local_a8._16_8_ = local_a8._16_8_ & 0xffffff0000000000;
            local_e8._0_8_ = local_128._M_head_impl;
            local_100._M_head_impl = (SSL *)0x0;
            local_f8._M_head_impl = (SSL *)0x0;
            pcVar3 = (char *)0x1;
            local_d8._0_8_ = pcVar1;
            aStack_c0._8_8_ = local_a8;
            local_148.ss_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._0_1_ =
                 (internal)
                 ConnectClientAndServer
                           ((UniquePtr<SSL> *)&local_100,(UniquePtr<SSL> *)&local_f8,
                            (this->super_SSLVersionTest).client_ctx_._M_t.
                            super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                            (this->super_SSLVersionTest).server_ctx_._M_t.
                            super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                            (ClientConfig *)local_e8,true);
            local_140 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if ((bool)local_148.ss_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._0_1_) {
              iVar2 = SSL_session_reused(local_100._M_head_impl);
              local_148.ss_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._0_1_ = (internal)(iVar2 != 0);
              local_140 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (!(bool)local_148.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_1_) {
                testing::Message::Message((Message *)&local_130);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_120,(internal *)&local_148,
                           (AssertionResult *)"SSL_session_reused(client.get())","false","true",
                           pcVar3);
                testing::internal::AssertHelper::AssertHelper
                          (&local_138,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0x20c9,(char *)CONCAT71(local_120._1_7_,local_120[0]));
                testing::internal::AssertHelper::operator=(&local_138,(Message *)&local_130);
                testing::internal::AssertHelper::~AssertHelper(&local_138);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_120._1_7_,local_120[0]) != &local_110) {
                  operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)CONCAT71(local_120._1_7_,local_120[0]),
                                  local_110._M_allocated_capacity + 1);
                }
                if (local_130._M_head_impl !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                {
                  (**(code **)(*(long *)local_130._M_head_impl + 8))();
                }
                if (local_140 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_140,local_140);
                }
              }
              iVar2 = SSL_session_reused(local_f8._M_head_impl);
              local_148.ss_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._0_1_ = (internal)(iVar2 != 0);
              local_140 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (!(bool)local_148.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_1_) {
                testing::Message::Message((Message *)&local_130);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_120,(internal *)&local_148,
                           (AssertionResult *)"SSL_session_reused(server.get())","false","true",
                           pcVar3);
                testing::internal::AssertHelper::AssertHelper
                          (&local_138,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0x20ca,(char *)CONCAT71(local_120._1_7_,local_120[0]));
                testing::internal::AssertHelper::operator=(&local_138,(Message *)&local_130);
                testing::internal::AssertHelper::~AssertHelper(&local_138);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_120._1_7_,local_120[0]) != &local_110) {
                  operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)CONCAT71(local_120._1_7_,local_120[0]),
                                  local_110._M_allocated_capacity + 1);
                }
                if (local_130._M_head_impl !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                {
                  (**(code **)(*(long *)local_130._M_head_impl + 8))();
                }
                if (local_140 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_140,local_140);
                }
              }
              pcVar3 = (char *)0x1;
              local_148.ss_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._0_1_ =
                   (internal)
                   ConnectClientAndServer
                             ((UniquePtr<SSL> *)&local_100,(UniquePtr<SSL> *)&local_f8,
                              (this->super_SSLVersionTest).client_ctx_._M_t.
                              super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                              (SSL_CTX *)local_f0,(ClientConfig *)local_e8,true);
              local_140 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (!(bool)local_148.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_1_) {
                testing::Message::Message((Message *)&local_130);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_120,(internal *)&local_148,
                           (AssertionResult *)
                           "ConnectClientAndServer(&client, &server, client_ctx_.get(), server_ctx2.get(), config)"
                           ,"false","true",pcVar3);
                testing::internal::AssertHelper::AssertHelper
                          (&local_138,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0x20ce,(char *)CONCAT71(local_120._1_7_,local_120[0]));
                testing::internal::AssertHelper::operator=(&local_138,(Message *)&local_130);
                goto LAB_001c996c;
              }
              iVar2 = SSL_session_reused(local_100._M_head_impl);
              local_148.ss_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._0_1_ = (internal)(iVar2 == 0);
              local_140 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (!(bool)local_148.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_1_) {
                testing::Message::Message((Message *)&local_130);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_120,(internal *)&local_148,
                           (AssertionResult *)"SSL_session_reused(client.get())","true","false",
                           pcVar3);
                testing::internal::AssertHelper::AssertHelper
                          (&local_138,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0x20cf,(char *)CONCAT71(local_120._1_7_,local_120[0]));
                testing::internal::AssertHelper::operator=(&local_138,(Message *)&local_130);
                testing::internal::AssertHelper::~AssertHelper(&local_138);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_120._1_7_,local_120[0]) != &local_110) {
                  operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)CONCAT71(local_120._1_7_,local_120[0]),
                                  local_110._M_allocated_capacity + 1);
                }
                if (local_130._M_head_impl !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                {
                  (**(code **)(*(long *)local_130._M_head_impl + 8))();
                }
                if (local_140 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_140,local_140);
                }
              }
              iVar2 = SSL_session_reused(local_f8._M_head_impl);
              local_148.ss_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._0_1_ = (internal)(iVar2 == 0);
              local_140 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (!(bool)local_148.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_1_) {
                testing::Message::Message((Message *)&local_130);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_120,(internal *)&local_148,
                           (AssertionResult *)"SSL_session_reused(server.get())","true","false",
                           pcVar3);
                testing::internal::AssertHelper::AssertHelper
                          (&local_138,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0x20d0,(char *)CONCAT71(local_120._1_7_,local_120[0]));
                testing::internal::AssertHelper::operator=(&local_138,(Message *)&local_130);
                goto LAB_001c996c;
              }
            }
            else {
              testing::Message::Message((Message *)&local_130);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_120,(internal *)&local_148,
                         (AssertionResult *)
                         "ConnectClientAndServer(&client, &server, client_ctx_.get(), server_ctx_.get(), config)"
                         ,"false","true",pcVar3);
              testing::internal::AssertHelper::AssertHelper
                        (&local_138,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x20c8,(char *)CONCAT71(local_120._1_7_,local_120[0]));
              testing::internal::AssertHelper::operator=(&local_138,(Message *)&local_130);
LAB_001c996c:
              testing::internal::AssertHelper::~AssertHelper(&local_138);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT71(local_120._1_7_,local_120[0]) != &local_110) {
                operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)CONCAT71(local_120._1_7_,local_120[0]),
                                local_110._M_allocated_capacity + 1);
              }
              if (local_130._M_head_impl !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)(*(long *)local_130._M_head_impl + 8))();
              }
              if (local_140 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_140,local_140);
              }
            }
            std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr
                      ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)&local_f8);
            std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr
                      ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)&local_100);
            if ((undefined1 *)aStack_c0._8_8_ != local_a8) {
              operator_delete((void *)aStack_c0._8_8_,(ulong)(local_a8._0_8_ + 1));
            }
            if ((pointer)local_d8._0_8_ != pcVar1) {
              operator_delete((void *)local_d8._0_8_,(ulong)(local_d8._16_8_ + 1));
            }
          }
          std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)&local_128);
          goto LAB_001c97e4;
        }
        testing::Message::Message(&local_148);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_e8,(internal *)local_120,
                   (AssertionResult *)
                   "SSL_CTX_set_tlsext_ticket_keys(server_ctx2.get(), key2, sizeof(key2))","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_128,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x20b8,(char *)local_e8._0_8_);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_128,&local_148);
      }
    }
    else {
      testing::Message::Message(&local_148);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_e8,(internal *)local_120,
                 (AssertionResult *)"UseCertAndKey(server_ctx2.get())","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_128,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x20b4,(char *)local_e8._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_128,&local_148);
    }
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_128);
  if ((GTestFlagSaver *)local_e8._0_8_ != (GTestFlagSaver *)local_d8) {
    operator_delete((void *)local_e8._0_8_,(ulong)(local_d8._0_8_ + 1));
  }
  if ((long *)CONCAT71(local_148.ss_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl._1_7_,
                       local_148.ss_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl._0_1_) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT71(local_148.ss_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl._1_7_,
                                   local_148.ss_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl._0_1_) + 8))();
  }
  if (local_118 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_118,local_118);
  }
LAB_001c97e4:
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> *)local_f0);
  return;
}

Assistant:

TEST_P(SSLVersionTest, DifferentKeyNoResume) {
  uint8_t key1[48], key2[48];
  RAND_bytes(key1, sizeof(key1));
  RAND_bytes(key2, sizeof(key2));

  bssl::UniquePtr<SSL_CTX> server_ctx2 = CreateContext();
  ASSERT_TRUE(server_ctx2);
  ASSERT_TRUE(UseCertAndKey(server_ctx2.get()));
  ASSERT_TRUE(
      SSL_CTX_set_tlsext_ticket_keys(server_ctx_.get(), key1, sizeof(key1)));
  ASSERT_TRUE(
      SSL_CTX_set_tlsext_ticket_keys(server_ctx2.get(), key2, sizeof(key2)));

  SSL_CTX_set_session_cache_mode(client_ctx_.get(), SSL_SESS_CACHE_BOTH);
  SSL_CTX_set_session_cache_mode(server_ctx_.get(), SSL_SESS_CACHE_BOTH);
  SSL_CTX_set_session_cache_mode(server_ctx2.get(), SSL_SESS_CACHE_BOTH);

  // Establish a session for |server_ctx_|.
  bssl::UniquePtr<SSL_SESSION> session =
      CreateClientSession(client_ctx_.get(), server_ctx_.get());
  ASSERT_TRUE(session);
  ClientConfig config;
  config.session = session.get();

  // Resuming with |server_ctx_| again works.
  bssl::UniquePtr<SSL> client, server;
  ASSERT_TRUE(ConnectClientAndServer(&client, &server, client_ctx_.get(),
                                     server_ctx_.get(), config));
  EXPECT_TRUE(SSL_session_reused(client.get()));
  EXPECT_TRUE(SSL_session_reused(server.get()));

  // Resuming with |server_ctx2| does not work.
  ASSERT_TRUE(ConnectClientAndServer(&client, &server, client_ctx_.get(),
                                     server_ctx2.get(), config));
  EXPECT_FALSE(SSL_session_reused(client.get()));
  EXPECT_FALSE(SSL_session_reused(server.get()));
}